

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_simd_qshl(DisasContext_conflict1 *s,_Bool scalar,_Bool is_q,_Bool src_unsigned,
                     _Bool dst_unsigned,int immh,int immb,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx;
  NeonGenTwo64OpEnvFn *pNVar1;
  TCGContext_conflict1 *pTVar2;
  code *pcVar3;
  MemOp memop;
  TCGv_i64 pTVar4;
  TCGTemp *pTVar5;
  TCGv_i32 pTVar6;
  uint uVar7;
  ulong uVar8;
  uint val;
  int line;
  MemOp MVar9;
  TCGArg a3;
  uintptr_t o;
  TCGv_i64 pTVar10;
  TCGv_i32 tcg_dest;
  long lVar11;
  bool bVar12;
  
  if (immh == 0) {
    uVar7 = 0x20;
  }
  else {
    uVar7 = 0x1f;
    if (immh != 0) {
      for (; (uint)immh >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  MVar9 = (MO_ALIGN_2|MO_BESL|MO_16) - uVar7;
  if (scalar && is_q) {
    __assert_fail("!(scalar && is_q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x2142,
                  "void handle_simd_qshl(DisasContext *, _Bool, _Bool, _Bool, _Bool, int, int, int, int)"
                 );
  }
  val = (-8 << ((byte)MVar9 & 0x1f)) + (immh * 8 | immb);
  tcg_ctx = s->uc->tcg_ctx;
  if (!scalar) {
    if ((immh & 8U) != 0 && !is_q) {
      unallocated_encoding_aarch64(s);
      return;
    }
    if (1 < uVar7 - 0x1c) {
      if (uVar7 != 0x1e) {
        if (uVar7 != 0x1f) {
          line = 0x2159;
LAB_006b9d78:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,line,(char *)0x0);
        }
        val = val | val * 0x100;
      }
      val = val | val << 0x10;
    }
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  if (uVar7 == 0x1c) {
    pTVar4 = tcg_const_i64_aarch64(tcg_ctx,(long)(int)val);
    pNVar1 = handle_simd_qshl::fns[src_unsigned][dst_unsigned];
    lVar11 = 0;
    do {
      pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      pTVar10 = (TCGv_i64)((long)pTVar5 - (long)tcg_ctx);
      pTVar2 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i64,(TCGArg)((long)pTVar2 + (long)pTVar10),
                          (TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                          lVar11 + ((long)(rn * 0x100 + 0xc00) | 0x10U));
      (*pNVar1)(tcg_ctx,pTVar10,tcg_ctx->cpu_env,pTVar10,pTVar4);
      pTVar2 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i64,(TCGArg)(pTVar10 + (long)pTVar2),
                          (TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                          (long)(rd * 0x100 + 0xc00) + 0x10 + lVar11);
      tcg_temp_free_internal_aarch64(tcg_ctx,pTVar5);
      if (!is_q) break;
      bVar12 = lVar11 == 0;
      lVar11 = lVar11 + 8;
    } while (bVar12);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  }
  else {
    pTVar6 = tcg_const_i32_aarch64(tcg_ctx,val);
    pcVar3 = *(code **)((long)handle_simd_qshl::fns_1[0][dst_unsigned] +
                       (long)(int)MVar9 * 8 + (ulong)((uint)src_unsigned * 0x30));
    memop = MO_32;
    if (scalar) {
      memop = MVar9;
    }
    a3 = (TCGArg)(rd * 0x100 + 0xc10);
    uVar8 = 0;
    do {
      pTVar5 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
      tcg_dest = (TCGv_i32)((long)pTVar5 - (long)tcg_ctx);
      read_vec_element_i32(s,tcg_dest,rn,(int)uVar8,memop);
      (*pcVar3)(tcg_ctx,tcg_dest,tcg_ctx->cpu_env,tcg_dest,pTVar6);
      if (scalar) {
        if (uVar7 != 0x1d) {
          if (uVar7 == 0x1e) {
            tcg_gen_ext16u_i32_aarch64(tcg_ctx,tcg_dest,tcg_dest);
          }
          else {
            if (uVar7 != 0x1f) {
              line = 0x219a;
              goto LAB_006b9d78;
            }
            tcg_gen_ext8u_i32_aarch64(tcg_ctx,tcg_dest,tcg_dest);
          }
        }
        write_fp_sreg(s,rd,tcg_dest);
      }
      else {
        pTVar2 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i32,(TCGArg)((long)pTVar2 + (long)tcg_dest),
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),a3);
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
      if (scalar) break;
      uVar8 = uVar8 + 1;
      a3 = a3 + 4;
    } while (uVar8 < (ulong)is_q * 2 + 2);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    if (scalar) {
      return;
    }
  }
  clear_vec_high(s,is_q,rd);
  return;
}

Assistant:

static void handle_simd_qshl(DisasContext *s, bool scalar, bool is_q,
                             bool src_unsigned, bool dst_unsigned,
                             int immh, int immb, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int immhb = immh << 3 | immb;
    int size = 32 - clz32(immh) - 1;
    int shift = immhb - (8 << size);
    int pass;

    assert(immh != 0);
    assert(!(scalar && is_q));

    if (!scalar) {
        if (!is_q && extract32(immh, 3, 1)) {
            unallocated_encoding(s);
            return;
        }

        /* Since we use the variable-shift helpers we must
         * replicate the shift count into each element of
         * the tcg_shift value.
         */
        switch (size) {
        case 0:
            shift |= shift << 8;
            /* fall through */
        case 1:
            shift |= shift << 16;
            break;
        case 2:
        case 3:
            break;
        default:
            g_assert_not_reached();
        }
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (size == 3) {
        TCGv_i64 tcg_shift = tcg_const_i64(tcg_ctx, shift);
        static NeonGenTwo64OpEnvFn * const fns[2][2] = {
            { gen_helper_neon_qshl_s64, gen_helper_neon_qshlu_s64 },
            { NULL, gen_helper_neon_qshl_u64 },
        };
        NeonGenTwo64OpEnvFn *genfn = fns[src_unsigned][dst_unsigned];
        int maxpass = is_q ? 2 : 1;

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_op, rn, pass, MO_64);
            genfn(tcg_ctx, tcg_op, tcg_ctx->cpu_env, tcg_op, tcg_shift);
            write_vec_element(s, tcg_op, rd, pass, MO_64);

            tcg_temp_free_i64(tcg_ctx, tcg_op);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_shift);
        clear_vec_high(s, is_q, rd);
    } else {
        TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, shift);
        static NeonGenTwoOpEnvFn * const fns[2][2][3] = {
            {
                { gen_helper_neon_qshl_s8,
                  gen_helper_neon_qshl_s16,
                  gen_helper_neon_qshl_s32 },
                { gen_helper_neon_qshlu_s8,
                  gen_helper_neon_qshlu_s16,
                  gen_helper_neon_qshlu_s32 }
            }, {
                { NULL, NULL, NULL },
                { gen_helper_neon_qshl_u8,
                  gen_helper_neon_qshl_u16,
                  gen_helper_neon_qshl_u32 }
            }
        };
        NeonGenTwoOpEnvFn *genfn = fns[src_unsigned][dst_unsigned][size];
        MemOp memop = scalar ? size : MO_32;
        int maxpass = scalar ? 1 : is_q ? 4 : 2;

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op, rn, pass, memop);
            genfn(tcg_ctx, tcg_op, tcg_ctx->cpu_env, tcg_op, tcg_shift);
            if (scalar) {
                switch (size) {
                case 0:
                    tcg_gen_ext8u_i32(tcg_ctx, tcg_op, tcg_op);
                    break;
                case 1:
                    tcg_gen_ext16u_i32(tcg_ctx, tcg_op, tcg_op);
                    break;
                case 2:
                    break;
                default:
                    g_assert_not_reached();
                }
                write_fp_sreg(s, rd, tcg_op);
            } else {
                write_vec_element_i32(s, tcg_op, rd, pass, MO_32);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op);
        }
        tcg_temp_free_i32(tcg_ctx, tcg_shift);

        if (!scalar) {
            clear_vec_high(s, is_q, rd);
        }
    }
}